

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

void __thiscall directory::directory(directory *this,string *typeName)

{
  size_t in_RCX;
  void *__buf;
  string sStack_248;
  fstream directoryFile;
  
  this->depth = 1;
  this->bucket_size = 2;
  (this->typeName)._M_dataplus._M_p = (pointer)&(this->typeName).field_2;
  (this->typeName)._M_string_length = 0;
  (this->typeName).field_2._M_local_buf[0] = '\0';
  (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&this->typeName);
  generateDirectoryFileName(&sStack_248,typeName);
  std::fstream::fstream(&directoryFile,(string *)&sStack_248,_S_out|_S_in|_S_bin);
  std::__cxx11::string::~string((string *)&sStack_248);
  read(this,(int)&directoryFile,__buf,in_RCX);
  std::fstream::~fstream(&directoryFile);
  return;
}

Assistant:

directory::directory(std::string typeName) {

    this->typeName = typeName;

    fstream directoryFile(generateDirectoryFileName(typeName), INOUTBIN);

    this->read(directoryFile);
}